

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

void __thiscall
llm_graph_input_pos_bucket::set_input(llm_graph_input_pos_bucket *this,llama_ubatch *ubatch)

{
  char cVar1;
  int32_t iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  void *pvVar6;
  int i;
  ulong uVar7;
  ulong uVar8;
  
  if (this->pos_bucket == (ggml_tensor *)0x0) {
    return;
  }
  uVar8 = (ulong)ubatch->n_tokens;
  cVar1 = ggml_backend_buffer_is_host(this->pos_bucket->buffer);
  if (cVar1 == '\0') {
    pcVar3 = "ggml_backend_buffer_is_host(pos_bucket->buffer)";
    uVar5 = 0x52;
  }
  else {
    if (ubatch->equal_seqs != true) {
      if (uVar8 == 0) {
        return;
      }
      pvVar6 = this->pos_bucket->data;
      uVar4 = 0;
      do {
        uVar7 = 0;
        do {
          iVar2 = llama_relative_position_bucket
                            (ubatch->pos[uVar7],ubatch->pos[uVar4],
                             (ulong)this->hparams->n_rel_attn_bkts,true);
          *(int32_t *)((long)pvVar6 + uVar7 * 4) = iVar2;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
        uVar4 = uVar4 + 1;
        pvVar6 = (void *)((long)pvVar6 + uVar8 * 4);
      } while (uVar4 != uVar8);
      return;
    }
    pcVar3 = "!ubatch->equal_seqs";
    uVar5 = 0x53;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar5,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

void llm_graph_input_pos_bucket::set_input(const llama_ubatch * ubatch) {
    if (pos_bucket) {
        const int64_t n_tokens = ubatch->n_tokens;

        GGML_ASSERT(ggml_backend_buffer_is_host(pos_bucket->buffer));
        GGML_ASSERT(!ubatch->equal_seqs); // TODO: use ubatch->n_seqs instead of failing

        int32_t * data = (int32_t *) pos_bucket->data;

        for (int h = 0; h < 1; ++h) {
            for (int j = 0; j < n_tokens; ++j) {
                for (int i = 0; i < n_tokens; ++i) {
                    data[h*(n_tokens*n_tokens) + j*n_tokens + i] = llama_relative_position_bucket(ubatch->pos[i], ubatch->pos[j], hparams.n_rel_attn_bkts, true);
                }
            }
        }
    }
}